

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
          (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *this)

{
  this->nStored = 0;
  pmr::polymorphic_allocator<unsigned_char>::deallocate_object<unsigned_char>
            (&this->alloc,this->ptr,this->nAlloc);
  return;
}

Assistant:

~vector() {
        clear();
        alloc.deallocate_object(ptr, nAlloc);
    }